

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall
testing::internal::GTestLog::GTestLog(GTestLog *this,GTestLogSeverity severity,char *file,int line)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_80;
  char *local_78;
  char *local_70;
  string local_50;
  char *local_30;
  char *marker;
  internal *piStack_20;
  int line_local;
  char *file_local;
  GTestLog *pGStack_10;
  GTestLogSeverity severity_local;
  GTestLog *this_local;
  
  this->severity_ = severity;
  if (severity == GTEST_INFO) {
    local_70 = "[  INFO ]";
  }
  else {
    if (severity == GTEST_WARNING) {
      local_78 = "[WARNING]";
    }
    else {
      if (severity == GTEST_ERROR) {
        local_80 = "[ ERROR ]";
      }
      else {
        local_80 = "[ FATAL ]";
      }
      local_78 = local_80;
    }
    local_70 = local_78;
  }
  local_30 = local_70;
  marker._4_4_ = line;
  piStack_20 = (internal *)file;
  file_local._4_4_ = severity;
  pGStack_10 = this;
  poVar1 = GetStream(this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," ");
  FormatFileLocation_abi_cxx11_(&local_50,piStack_20,(char *)(ulong)marker._4_4_,severity);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_50);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

GTestLog::GTestLog(GTestLogSeverity severity, const char* file, int line)
    : severity_(severity) {
  const char* const marker = severity == GTEST_INFO      ? "[  INFO ]"
                             : severity == GTEST_WARNING ? "[WARNING]"
                             : severity == GTEST_ERROR   ? "[ ERROR ]"
                                                         : "[ FATAL ]";
  GetStream() << ::std::endl
              << marker << " " << FormatFileLocation(file, line).c_str()
              << ": ";
}